

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O0

void __thiscall csv::internals::CSVFieldList::allocate(CSVFieldList *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  RawCSVField *__p;
  reference this_00;
  pointer pRVar3;
  unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>
  local_18;
  CSVFieldList *local_10;
  CSVFieldList *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->_single_buffer_capacity;
  uVar2 = SUB168(auVar1 * ZEXT816(0x18),0);
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  local_10 = this;
  __p = (RawCSVField *)operator_new__(uVar2);
  std::unique_ptr<csv::internals::RawCSVField[],std::default_delete<csv::internals::RawCSVField[]>>
  ::
  unique_ptr<csv::internals::RawCSVField*,std::default_delete<csv::internals::RawCSVField[]>,void,bool>
            ((unique_ptr<csv::internals::RawCSVField[],std::default_delete<csv::internals::RawCSVField[]>>
              *)&local_18,__p);
  std::
  deque<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>,_std::allocator<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>_>_>
  ::push_back(&this->buffers,(value_type *)&local_18);
  std::
  unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>::
  ~unique_ptr(&local_18);
  this->_current_buffer_size = 0;
  this_00 = std::
            deque<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>,_std::allocator<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>_>_>
            ::back(&this->buffers);
  pRVar3 = std::
           unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>
           ::get(this_00);
  this->_back = pRVar3;
  return;
}

Assistant:

CSV_INLINE void CSVFieldList::allocate() {
            buffers.push_back(std::unique_ptr<RawCSVField[]>(new RawCSVField[_single_buffer_capacity]));

            _current_buffer_size = 0;
            _back = buffers.back().get();
        }